

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

void __thiscall
de::BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
          (BlockBuffer<de::BlockBufferBasicTest::Message> *this,int blockSize,int numBlocks)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  Message *pMVar5;
  int *piVar6;
  deSemaphore dVar7;
  Message *local_68;
  int numBlocks_local;
  int blockSize_local;
  BlockBuffer<de::BlockBufferBasicTest::Message> *this_local;
  
  this->m_fill = 0;
  this->m_empty = 0;
  this->m_writeBlock = 0;
  this->m_writePos = 0;
  this->m_readBlock = 0;
  this->m_readPos = 0;
  this->m_blockSize = blockSize;
  this->m_numBlocks = numBlocks;
  this->m_elements = (Message *)0x0;
  this->m_numUsedInBlock = (int *)0x0;
  Mutex::Mutex(&this->m_writeLock,0);
  Mutex::Mutex(&this->m_readLock,0);
  this->m_canceled = 0;
  uVar3 = (ulong)(this->m_numBlocks * this->m_blockSize);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pMVar5 = (Message *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_68 = pMVar5;
    do {
      BlockBufferBasicTest::Message::Message(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != pMVar5 + uVar3);
  }
  this->m_elements = pMVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->m_numBlocks;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar3);
  this->m_numUsedInBlock = piVar6;
  dVar7 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  this->m_fill = dVar7;
  dVar7 = deSemaphore_create(numBlocks,(deSemaphoreAttributes *)0x0);
  this->m_empty = dVar7;
  return;
}

Assistant:

BlockBuffer<T>::BlockBuffer (int blockSize, int numBlocks)
	: m_fill			(0)
	, m_empty			(0)
	, m_writeBlock		(0)
	, m_writePos		(0)
	, m_readBlock		(0)
	, m_readPos			(0)
	, m_blockSize		(blockSize)
	, m_numBlocks		(numBlocks)
	, m_elements		(DE_NULL)
	, m_numUsedInBlock	(DE_NULL)
	, m_writeLock		()
	, m_readLock		()
	, m_canceled		(DE_FALSE)
{
	DE_ASSERT(blockSize > 0);
	DE_ASSERT(numBlocks > 0);

	try
	{
		m_elements			= new T[m_numBlocks*m_blockSize];
		m_numUsedInBlock	= new int[m_numBlocks];
	}
	catch (...)
	{
		delete[] m_elements;
		delete[] m_numUsedInBlock;
		throw;
	}

	m_fill	= deSemaphore_create(0, DE_NULL);
	m_empty	= deSemaphore_create(numBlocks, DE_NULL);
	DE_ASSERT(m_fill && m_empty);
}